

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

lys_module *
ly_ctx_load_sub_module
          (ly_ctx *ctx,lys_module *module,char *name,char *revision,int implement,
          unres_schema *unres)

{
  lys_module *module_00;
  lys_module **pplVar1;
  uint uVar2;
  int iVar3;
  lys_module *plVar4;
  LY_ERR *pLVar5;
  lys_module *plVar6;
  char *pcVar7;
  size_t sVar8;
  int *piVar9;
  char *pcVar10;
  char **ppcVar11;
  _func_void_void_ptr_void_ptr **__s;
  lys_revision *plVar12;
  _func_void_void_ptr_void_ptr **pp_Var13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  int in_stack_00000008;
  _func_void_void_ptr_void_ptr **in_stack_ffffffffffffef58;
  _func_void_void_ptr_void_ptr *local_1098 [513];
  _func_void_void_ptr_void_ptr **local_90;
  long local_88;
  lys_module *local_80;
  unres_schema *local_78;
  LYS_INFORMAT local_6c;
  char *pcStack_68;
  LYS_INFORMAT format_1;
  lys_module *local_60;
  char *local_58;
  ly_ctx *local_50;
  int local_44;
  char *local_40;
  undefined8 local_38;
  LYS_INFORMAT format;
  
  local_78 = unres;
  local_60 = module;
  local_44 = implement;
  local_40 = name;
  if (module == (lys_module *)0x0) {
    if (ctx->internal_module_count == '\0') {
      uVar17 = 0;
    }
    else {
      ppcVar11 = &internal_modules[0].revision;
      uVar16 = 0;
      do {
        iVar3 = ly_strequal_(local_40,((internal_modules_s *)(ppcVar11 + -1))->name);
        if (iVar3 != 0) {
          if (revision == (char *)0x0) {
            revision = (char *)0x0;
LAB_0010cd38:
            plVar6 = ly_ctx_get_module_by(ctx,local_40,0,8,revision,0,in_stack_00000008);
            return plVar6;
          }
          iVar3 = ly_strequal_(revision,*ppcVar11);
          if (iVar3 != 0) goto LAB_0010cd38;
        }
        uVar16 = uVar16 + 1;
        uVar17 = (ulong)ctx->internal_module_count;
        ppcVar11 = ppcVar11 + 4;
      } while (uVar16 < uVar17);
    }
    if ((int)uVar17 < (ctx->models).used) {
      plVar6 = (lys_module *)0x0;
      do {
        module_00 = (ctx->models).list[uVar17];
        iVar3 = ly_strequal_(local_40,module_00->name);
        plVar4 = plVar6;
        if (iVar3 != 0) {
          plVar4 = module_00;
          if ((plVar6 != (lys_module *)0x0) &&
             (((module_00->rev_size == '\0' || (plVar6->rev_size == '\0')) ||
              (iVar3 = strcmp(module_00->rev->date,plVar6->rev->date), iVar3 < 1)))) {
            plVar4 = plVar6;
          }
          if (revision == (char *)0x0) {
            uVar2 = *(uint *)&module_00->field_0x40;
            if ((uVar2 >> 8 & 1) != 0) goto LAB_0010cd55;
          }
          else if ((module_00->rev_size != '\0') &&
                  (iVar3 = strcmp(revision,module_00->rev->date), iVar3 == 0)) {
            uVar2 = (uint)*(ushort *)&module_00->field_0x40;
            goto LAB_0010cd55;
          }
          if ((local_44 != 0) &&
             ((revision == (char *)0x0 &&
              (uVar2 = (uint)*(ushort *)&module_00->field_0x40,
              (*(ushort *)&module_00->field_0x40 & 0x80) != 0)))) {
LAB_0010cd55:
            if ((uVar2 & 0x40) != 0) {
              lys_set_enabled(module_00);
            }
            if (local_44 == 0) {
              return module_00;
            }
            iVar3 = lys_set_implemented(module_00);
            if (iVar3 == 0) {
              return module_00;
            }
            return (lys_module *)0x0;
          }
        }
        uVar17 = uVar17 + 1;
        plVar6 = plVar4;
      } while ((int)uVar17 < (ctx->models).used);
      goto LAB_0010cbd1;
    }
  }
  plVar4 = (lys_module *)0x0;
LAB_0010cbd1:
  uVar2 = (ctx->models).flags;
  pcVar10 = local_40;
  local_80 = plVar4;
  local_58 = revision;
  local_50 = ctx;
  if (ctx->imp_clb != (ly_module_imp_clb)0x0 && (uVar2 & 0x20) == 0) goto LAB_0010cd8c;
  do {
    if ((uVar2 & 8) == 0) {
      local_38 = (_func_void_void_ptr_void_ptr **)0x0;
      iVar3 = lys_search_localfile
                        ((ctx->models).search_paths,(uint)((uVar2 & 0x10) == 0),pcVar10,revision,
                         (char **)&local_38,&local_6c);
      if (iVar3 != 0) goto LAB_0010cec6;
      if (local_38 == (_func_void_void_ptr_void_ptr **)0x0) {
        if ((local_60 != (lys_module *)0x0 || revision != (char *)0x0) ||
           (plVar6 = ly_ctx_get_module_by
                               (ctx,pcVar10,0,8,(char *)0x0,0,(int)in_stack_ffffffffffffef58),
           plVar6 == (lys_module *)0x0)) {
          ly_log(ctx,LY_LLERR,LY_ESYS,"Data model \"%s\" not found.",pcVar10);
          goto LAB_0010cecf;
        }
        goto LAB_0010cede;
      }
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Loading schema from \"%s\" file.");
      pcStack_68 = strrchr((char *)local_38,0x2e);
      pcStack_68[1] = '\0';
      if ((revision == (char *)0x0) && (lVar14 = (long)(local_50->models).used, 0 < lVar14)) {
        pplVar1 = (local_50->models).list;
        local_90 = local_38;
        lVar15 = 0;
        local_88 = lVar14;
        do {
          plVar6 = pplVar1[lVar15];
          pcVar10 = plVar6->filepath;
          if ((pcVar10 != (char *)0x0) &&
             (iVar3 = strcmp(local_40,plVar6->name), pp_Var13 = local_90, iVar3 == 0)) {
            sVar8 = strlen((char *)local_90);
            lVar14 = local_88;
            iVar3 = strncmp((char *)pp_Var13,pcVar10,sVar8);
            revision = local_58;
            if (iVar3 == 0) {
              if ((local_44 == 0) || ((*(ushort *)&plVar6->field_0x40 & 0x80) != 0)) {
                if ((*(ushort *)&plVar6->field_0x40 & 0x40) != 0) {
                  lys_set_enabled(plVar6);
                }
                goto LAB_0010d22a;
              }
              iVar3 = lys_set_implemented(plVar6);
              ctx = local_50;
              revision = local_58;
              pcVar10 = local_40;
              if (iVar3 != 0) goto LAB_0010cec6;
              goto LAB_0010d22a;
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar14 != lVar15);
      }
      pcStack_68[1] = 'y';
      iVar3 = open((char *)local_38,0);
      pp_Var13 = local_38;
      pcVar10 = local_40;
      ctx = local_50;
      revision = local_58;
      if (iVar3 < 0) {
        piVar9 = __errno_location();
        pcVar10 = strerror(*piVar9);
        ctx = local_50;
        ly_log(local_50,LY_LLERR,LY_ESYS,"Unable to open data model file \"%s\" (%s).",pp_Var13,
               pcVar10);
        revision = local_58;
        pcVar10 = local_40;
      }
      else {
        if (local_60 == (lys_module *)0x0) {
          plVar6 = lys_parse_fd_(local_50,iVar3,local_6c,local_58,local_44);
        }
        else {
          plVar6 = (lys_module *)lys_sub_parse_fd(local_60,iVar3,local_6c,local_78);
        }
        close(iVar3);
        pp_Var13 = local_38;
        if (plVar6 != (lys_module *)0x0) {
          pcVar10 = strrchr((char *)local_38,0x2f);
          __s = (_func_void_void_ptr_void_ptr **)(pcVar10 + 1);
          if (pcVar10 == (char *)0x0) {
            __s = pp_Var13;
          }
          local_40 = strchr((char *)__s,0x40);
          pcVar10 = plVar6->name;
          sVar8 = strlen(pcVar10);
          iVar3 = strncmp((char *)__s,pcVar10,sVar8);
          if (iVar3 == 0) {
            pcVar7 = local_40;
            if (local_40 == (char *)0x0) {
              pcVar7 = pcStack_68;
            }
            if ((char *)((long)__s + sVar8) != pcVar7) goto LAB_0010d124;
          }
          else {
LAB_0010d124:
            ly_log(local_50,LY_LLWRN,LY_SUCCESS,
                   "File name \"%s\" does not match module name \"%s\".",__s,pcVar10);
          }
          if (local_40 != (char *)0x0) {
            if ((plVar6->rev_size == '\0') || ((long)pcStack_68 - (long)(local_40 + 1) != 10)) {
              if (plVar6->rev_size == '\0') {
                pcVar10 = "none";
              }
              else {
                pcVar10 = plVar6->rev->date;
              }
            }
            else {
              pcVar10 = plVar6->rev->date;
              iVar3 = strncmp(pcVar10,local_40 + 1,10);
              if (iVar3 == 0) goto LAB_0010d1f2;
            }
            ly_log(local_50,LY_LLWRN,LY_SUCCESS,
                   "File name \"%s\" does not match module revision \"%s\".",__s,pcVar10);
          }
LAB_0010d1f2:
          if (plVar6->filepath == (char *)0x0) {
            pcVar10 = realpath((char *)local_38,(char *)local_1098);
            pp_Var13 = local_38;
            if (pcVar10 != (char *)0x0) {
              pp_Var13 = local_1098;
            }
            pcVar10 = lydict_insert(local_50,(char *)pp_Var13,0);
            plVar6->filepath = pcVar10;
          }
LAB_0010d22a:
          free(local_38);
          goto LAB_0010cede;
        }
      }
LAB_0010cec6:
      free(local_38);
    }
LAB_0010cecf:
    if (((ctx->models).flags & 0x20) == 0) break;
    if (ctx->imp_clb != (ly_module_imp_clb)0x0) {
LAB_0010cd8c:
      local_38 = (_func_void_void_ptr_void_ptr **)((ulong)local_38._4_4_ << 0x20);
      local_1098[0] = (_func_void_void_ptr_void_ptr *)0x0;
      pLVar5 = ly_errno_glob_address();
      *pLVar5 = LY_SUCCESS;
      if (local_60 == (lys_module *)0x0) {
        in_stack_ffffffffffffef58 = local_1098;
        plVar6 = (lys_module *)0x0;
        pcVar7 = (*ctx->imp_clb)(pcVar10,revision,(char *)0x0,(char *)0x0,ctx->imp_clb_data,
                                 (LYS_INFORMAT *)&local_38,in_stack_ffffffffffffef58);
        if (pcVar7 == (char *)0x0) goto LAB_0010ce63;
        plVar6 = lys_parse_mem_(ctx,pcVar7,(LYS_INFORMAT)local_38,(char *)0x0,0,local_44);
LAB_0010ce48:
        if (local_1098[0] != (_func_void_void_ptr_void_ptr *)0x0) {
          (*local_1098[0])(pcVar7);
        }
      }
      else {
        plVar6 = lys_main_module(local_60);
        plVar12 = (lys_revision *)0x0;
        if (plVar6->rev_size != '\0') {
          plVar12 = plVar6->rev;
        }
        in_stack_ffffffffffffef58 = local_1098;
        pcVar7 = (*ctx->imp_clb)(plVar6->name,plVar12->date,pcVar10,revision,ctx->imp_clb_data,
                                 (LYS_INFORMAT *)&local_38,in_stack_ffffffffffffef58);
        if (pcVar7 != (char *)0x0) {
          plVar6 = (lys_module *)lys_sub_parse_mem(local_60,pcVar7,(LYS_INFORMAT)local_38,local_78);
          goto LAB_0010ce48;
        }
LAB_0010ce63:
        pLVar5 = ly_errno_glob_address();
        if (*pLVar5 != LY_SUCCESS) {
          pLVar5 = ly_errno_glob_address();
          ly_log(ctx,LY_LLERR,*pLVar5,"User module retrieval callback failed!");
          goto LAB_0010ce8e;
        }
      }
      if (plVar6 != (lys_module *)0x0) goto LAB_0010cede;
    }
LAB_0010ce8e:
    uVar2 = (ctx->models).flags;
  } while ((uVar2 & 0x20) == 0);
  plVar6 = (lys_module *)0x0;
LAB_0010cede:
  if (local_80 == (lys_module *)0x0) {
    local_80 = plVar6;
  }
  if (plVar6 != (lys_module *)0x0) {
    local_80 = plVar6;
  }
  if ((revision == (char *)0x0) && (local_80 != (lys_module *)0x0)) {
    local_80->field_0x41 = local_80->field_0x41 | 1;
  }
  return local_80;
}

Assistant:

const struct lys_module *
ly_ctx_load_sub_module(struct ly_ctx *ctx, struct lys_module *module, const char *name, const char *revision,
                       int implement, struct unres_schema *unres)
{
    struct lys_module *mod = NULL, *latest_mod = NULL;
    int i;

    if (!module) {
        /* exception for internal modules */
        for (i = 0; i < ctx->internal_module_count; i++) {
            if (ly_strequal(name, internal_modules[i].name, 0)) {
                if (!revision || ly_strequal(revision, internal_modules[i].revision, 0)) {
                    /* return internal module */
                    return (struct lys_module *)ly_ctx_get_module(ctx, name, revision, 0);
                }
            }
        }
        /* try to get the schema from the context (with or without revision),
         * include the disabled modules in the search to avoid their duplication,
         * they are enabled by the subsequent call to lys_set_implemented() */
        for (i = ctx->internal_module_count, mod = NULL; i < ctx->models.used; i++) {
            mod = ctx->models.list[i]; /* shortcut */
            if (ly_strequal(name, mod->name, 0)) {
                /* first remember latest module if no other is found */
                if (!latest_mod) {
                    latest_mod = mod;
                } else {
                    if (mod->rev_size && latest_mod->rev_size && (strcmp(mod->rev[0].date, latest_mod->rev[0].date) > 0)) {
                        /* newer revision */
                        latest_mod = mod;
                    }
                }

                if (revision && mod->rev_size && !strcmp(revision, mod->rev[0].date)) {
                    /* the specific revision was already loaded */
                    break;
                } else if (!revision && mod->latest_revision) {
                    /* the latest revision of this module was already loaded */
                    break;
                } else if (implement && mod->implemented && !revision) {
                    /* we are not able to implement another module, so consider this module as the latest one */
                    break;
                }
            }
            mod = NULL;
        }
        if (mod) {
            /* module must be enabled */
            if (mod->disabled) {
                lys_set_enabled(mod);
            }
            /* module is supposed to be implemented */
            if (implement && lys_set_implemented(mod)) {
                /* the schema cannot be implemented */
                mod = NULL;
            }
            return mod;
        }
    }

    /* module is not yet in context, use the user callback or try to find the schema on our own */
    if (ctx->imp_clb && !(ctx->models.flags & LY_CTX_PREFER_SEARCHDIRS)) {
search_clb:
        if (ctx->imp_clb) {
            mod = ly_ctx_load_sub_module_clb(ctx, module, name, revision, implement, unres);
        }
        if (!mod && !(ctx->models.flags & LY_CTX_PREFER_SEARCHDIRS)) {
            goto search_file;
        }
    } else {
search_file:
        if (!(ctx->models.flags & LY_CTX_DISABLE_SEARCHDIRS)) {
            /* module was not received from the callback or there is no callback set */
            mod = ly_ctx_load_localfile(ctx, module, name, revision, implement, unres);
        }
        if (!mod && (ctx->models.flags & LY_CTX_PREFER_SEARCHDIRS)) {
            goto search_clb;
        }
    }

    if (!mod && latest_mod) {
        /* consider the latest mod found as the latest available */
        mod = latest_mod;
    }

#ifdef LY_ENABLED_LATEST_REVISIONS
    if (!revision && mod) {
        /* module is the latest revision found */
        mod->latest_revision = 1;
    }
#endif

    return mod;
}